

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

void sink_info_callback(pa_context *context,pa_sink_info *info,int eol,void *u)

{
  void *pvVar1;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  cubeb_conflict *ctx;
  
  if (in_EDX == 0) {
    free(*(void **)(in_RCX + 0x20));
    pvVar1 = malloc(0x8c);
    *(void **)(in_RCX + 0x20) = pvVar1;
    memcpy(*(void **)(in_RCX + 0x20),(void *)(in_RSI + 0x24),0x84);
    *(undefined4 *)(*(long *)(in_RCX + 0x20) + 0x84) = *(undefined4 *)(in_RSI + 0x1c);
    *(undefined4 *)(*(long *)(in_RCX + 0x20) + 0x88) = *(undefined4 *)(in_RSI + 0x150);
  }
  (*cubeb_pa_threaded_mainloop_signal)(*(pa_threaded_mainloop **)(in_RCX + 0x10),0);
  return;
}

Assistant:

static void
sink_info_callback(pa_context * context, const pa_sink_info * info, int eol, void * u)
{
  (void)context;
  cubeb * ctx = u;
  if (!eol) {
    free(ctx->default_sink_info);
    ctx->default_sink_info = malloc(sizeof(struct cubeb_default_sink_info));
    memcpy(&ctx->default_sink_info->channel_map, &info->channel_map, sizeof(pa_channel_map));
    ctx->default_sink_info->sample_spec_rate = info->sample_spec.rate;
    ctx->default_sink_info->flags = info->flags;
  }
  WRAP(pa_threaded_mainloop_signal)(ctx->mainloop, 0);
}